

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopClear(sqlite3 *db,WhereLoop *p)

{
  sqlite3 *in_RSI;
  WhereLoop *in_stack_ffffffffffffffe8;
  
  if ((u32 *)in_RSI->lastRowid != &in_RSI->nSchemaLock) {
    sqlite3DbFreeNN(in_RSI,in_stack_ffffffffffffffe8);
  }
  whereLoopClearUnion(in_RSI,in_stack_ffffffffffffffe8);
  whereLoopInit((WhereLoop *)in_RSI);
  return;
}

Assistant:

static void whereLoopClear(sqlite3 *db, WhereLoop *p){
  if( p->aLTerm!=p->aLTermSpace ) sqlite3DbFreeNN(db, p->aLTerm);
  whereLoopClearUnion(db, p);
  whereLoopInit(p);
}